

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
ReadLinearExpr<ExprPrinter::LinearPartHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
           *this,int num_terms,LinearPartHandler linear_expr)

{
  int var_index;
  int iVar1;
  bool bVar2;
  double coef;
  LinearPartHandler local_30;
  
  local_30._8_8_ = linear_expr._8_8_;
  local_30._0_8_ = linear_expr._0_8_;
  iVar1 = 0;
  if (0 < num_terms) {
    iVar1 = num_terms;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    var_index = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars);
    coef = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this->reader_);
    ExprPrinter::LinearPartHandler::AddTerm(&local_30,var_index,coef);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}